

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int CollectionSetHeader(unqlite_kv_engine *pEngine,unqlite_col *pCol,jx9_int64 iRec,jx9_int64 iTotal
                       ,jx9_value *pSchema)

{
  long lVar1;
  undefined8 uVar2;
  sxi32 sVar3;
  undefined8 *puVar4;
  SyString *pId;
  uchar *zBinary;
  unqlite_vfs *puStack_60;
  sxu32 iDos;
  unqlite_vfs *pVfs;
  Sytm *pCreate;
  int rc;
  int iWrite;
  unqlite_kv_methods *pMethods;
  SyBlob *pHeader;
  jx9_value *pSchema_local;
  jx9_int64 iTotal_local;
  jx9_int64 iRec_local;
  unqlite_col *pCol_local;
  unqlite_kv_engine *pEngine_local;
  
  pMethods = (unqlite_kv_methods *)&pCol->sHeader;
  pCreate._4_4_ = 0;
  pHeader = (SyBlob *)pSchema;
  pSchema_local = (jx9_value *)iTotal;
  iTotal_local = iRec;
  iRec_local = (jx9_int64)pCol;
  pCol_local = (unqlite_col *)pEngine;
  if (pEngine == (unqlite_kv_engine *)0x0) {
    pCol_local = (unqlite_col *)unqlitePagerGetKvEngine(pCol->pVm->pDb);
  }
  _rc = (pCol_local->pVm->sAlloc).pMutexMethods;
  if (pMethods->iVersion == 0) {
    pVfs = (unqlite_vfs *)(iRec_local + 0xe0);
    pCreate._0_4_ = SyBlobAppendBig16((SyBlob *)pMethods,0x611e);
    if ((sxi32)pCreate != 0) {
      return (sxi32)pCreate;
    }
    pCreate._0_4_ = SyBlobAppendBig64((SyBlob *)pMethods,0);
    if ((sxi32)pCreate != 0) {
      return (sxi32)pCreate;
    }
    pCreate._0_4_ = SyBlobAppendBig64((SyBlob *)pMethods,0);
    if ((sxi32)pCreate != 0) {
      return (sxi32)pCreate;
    }
    puStack_60 = unqliteExportBuiltinVfs();
    if (puStack_60->xCurrentTime == (_func_int_unqlite_vfs_ptr_Sytm_ptr *)0x0) {
      SyZero(pVfs,0x38);
    }
    else {
      (*puStack_60->xCurrentTime)(puStack_60,(Sytm *)pVfs);
    }
    SyTimeFormatToDos((Sytm *)pVfs,(sxu32 *)((long)&zBinary + 4));
    sVar3 = SyBlobAppendBig32((SyBlob *)pMethods,zBinary._4_4_);
    if (sVar3 != 0) {
      return sVar3;
    }
    *(int *)(iRec_local + 0x60) = pMethods->iVersion;
    pCreate._4_4_ = 1;
    pCreate._0_4_ = 0;
  }
  else {
    lVar1 = *(long *)&pMethods->szKv;
    if (-1 < iTotal_local) {
      SyBigEndianPack64((uchar *)(lVar1 + 2),iTotal_local);
      pCreate._4_4_ = 1;
    }
    if (-1 < (long)pSchema_local) {
      SyBigEndianPack64((uchar *)(lVar1 + 10),(sxu64)pSchema_local);
      pCreate._4_4_ = 1;
    }
    if (pHeader != (SyBlob *)0x0) {
      SyBlobTruncate((SyBlob *)pMethods,*(sxu32 *)(iRec_local + 0x60));
      pCreate._0_4_ = FastJsonEncode((jx9_value *)pHeader,(SyBlob *)pMethods,0);
      if ((sxi32)pCreate != 0) {
        return (sxi32)pCreate;
      }
      jx9MemObjStore((jx9_value *)pHeader,(jx9_value *)(iRec_local + 0x20));
      pCreate._4_4_ = 1;
    }
  }
  if (pCreate._4_4_ != 0) {
    puVar4 = (undefined8 *)(iRec_local + 8);
    uVar2._0_4_ = pMethods->szKv;
    uVar2._4_4_ = pMethods->szCursor;
    pCreate._0_4_ =
         (*_rc[1].xGlobalInit)
                   (pCol_local,*puVar4,(ulong)*(uint *)(iRec_local + 0x10),uVar2,
                    (ulong)(uint)pMethods->iVersion);
    if ((sxi32)pCreate != 0) {
      unqliteGenErrorFormat
                ((unqlite *)**(undefined8 **)iRec_local,
                 "Cannot save collection \'%z\' header in the underlying storage engine",puVar4);
      return (sxi32)pCreate;
    }
  }
  return 0;
}

Assistant:

static int CollectionSetHeader(
	unqlite_kv_engine *pEngine, /* Underlying KV storage engine */
	unqlite_col *pCol,          /* Target collection */
	jx9_int64 iRec,             /* Last record ID */
	jx9_int64 iTotal,           /* Total number of records in this collection */
	jx9_value *pSchema          /* Collection schema */
	)
{
	SyBlob *pHeader = &pCol->sHeader;
	unqlite_kv_methods *pMethods;
	int iWrite = 0;
	int rc;
	if( pEngine == 0 ){
		/* Default storage engine */
		pEngine = unqlitePagerGetKvEngine(pCol->pVm->pDb);
	}
	pMethods = pEngine->pIo->pMethods;
	if( SyBlobLength(pHeader) < 1 ){
		Sytm *pCreate = &pCol->sCreation; /* Creation time */
		unqlite_vfs *pVfs;
		sxu32 iDos;
		/* Magic number */
		rc = SyBlobAppendBig16(pHeader,UNQLITE_COLLECTION_MAGIC);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Initial record ID */
		rc = SyBlobAppendBig64(pHeader,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Total records in the collection */
		rc = SyBlobAppendBig64(pHeader,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		pVfs = (unqlite_vfs *)unqliteExportBuiltinVfs();
		/* Creation time of the collection */
		if( pVfs->xCurrentTime ){
			/* Get the creation time */
			pVfs->xCurrentTime(pVfs,pCreate);
		}else{
			/* Zero the structure */
			SyZero(pCreate,sizeof(Sytm));
		}
		/* Convert to DOS time */
		SyTimeFormatToDos(pCreate,&iDos);
		rc = SyBlobAppendBig32(pHeader,iDos);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Offset to start writing collection schema */
		pCol->nSchemaOfft = SyBlobLength(pHeader);
		iWrite = 1;
	}else{
		unsigned char *zBinary = (unsigned char *)SyBlobData(pHeader);
		/* Header update */
		if( iRec >= 0 ){
			/* Update record ID */
			SyBigEndianPack64(&zBinary[2/* Magic number*/],(sxu64)iRec);
			iWrite = 1;
		}
		if( iTotal >= 0 ){
			/* Total records */
			SyBigEndianPack64(&zBinary[2/* Magic number*/+8/* Record ID*/],(sxu64)iTotal);
			iWrite = 1;
		}
		if( pSchema ){
			/* Collection Schema */
			SyBlobTruncate(pHeader,pCol->nSchemaOfft);
			/* Encode the schema to FastJson */
			rc = FastJsonEncode(pSchema,pHeader,0);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Copy the collection schema */
			jx9MemObjStore(pSchema,&pCol->sSchema);
			iWrite = 1;
		}
	}
	if( iWrite ){
		SyString *pId = &pCol->sName;
		/* Reflect the disk and/or in-memory image */
		rc = pMethods->xReplace(pEngine,
			(const void *)pId->zString,pId->nByte,
			SyBlobData(pHeader),SyBlobLength(pHeader)
			);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pCol->pVm->pDb,
				"Cannot save collection '%z' header in the underlying storage engine",
				pId
				);
			return rc;
		}
	}
	return UNQLITE_OK;
}